

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_op_addr_addi(DisasContext_conflict6 *ctx,TCGv_i64 ret,TCGv_i64 base,target_long ofs)

{
  TCGContext_conflict6 *tcg_ctx;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  tcg_gen_addi_i64_mips64el(tcg_ctx,ret,base,ofs);
  if ((ctx->hflags & 0x200) == 0) {
    return;
  }
  tcg_gen_ext32s_i64_mips64el(tcg_ctx,ret,ret);
  return;
}

Assistant:

static inline void gen_op_addr_addi(DisasContext *ctx, TCGv ret, TCGv base,
                                    target_long ofs)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    tcg_gen_addi_tl(tcg_ctx, ret, base, ofs);

#if defined(TARGET_MIPS64)
    if (ctx->hflags & MIPS_HFLAG_AWRAP) {
        tcg_gen_ext32s_i64(tcg_ctx, ret, ret);
    }
#endif
}